

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsenumber.cpp
# Opt level: O0

NumberType ICM::Parser::parseNumber(char *ptr,uint64_t *value)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  uint64_t *puVar4;
  char *pcVar5;
  NumberType local_218;
  allocator local_1e9;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  uint64_t local_1a0;
  int64_t result2;
  undefined1 auStack_178 [8];
  longdouble result1;
  charptr front_1;
  string local_148;
  string local_128;
  undefined1 local_108 [8];
  charptr front;
  string local_c8;
  undefined1 local_a8 [8];
  charptr cp;
  string local_88;
  uint64_t *local_68;
  char *end;
  byte local_4a;
  allocator local_49;
  string local_48;
  Format local_28;
  bool local_21;
  Format format;
  bool minus;
  uint64_t *value_local;
  char *ptr_local;
  
  local_21 = false;
  local_28 = f_dec;
  if (*ptr == '+') {
    value_local = (uint64_t *)(ptr + 1);
  }
  else {
    local_21 = *ptr == '-';
    value_local = (uint64_t *)ptr;
    if (local_21) {
      value_local = (uint64_t *)(ptr + 1);
    }
  }
  _format = (longdouble *)value;
  if ((char)*value_local == '0') {
    cVar1 = *(char *)((long)value_local + 1);
    if (cVar1 == '.') {
      pcVar5 = (char *)((long)value_local + 2);
      value_local = (uint64_t *)((long)value_local + 1);
      bVar2 = checkBehindNumber(pcVar5,10,(char **)0x0);
      local_4a = 0;
      end._3_1_ = 0;
      if (bVar2) {
        pcVar5 = (char *)((long)value_local + -1);
        std::allocator<char>::allocator();
        local_4a = 1;
        std::__cxx11::string::string((string *)&local_48,pcVar5,&local_49);
        end._3_1_ = 1;
        local_218 = parseFloat(&local_48,(uint64_t *)_format,(bool)(local_21 & 1));
      }
      else {
        local_218 = nt_unknown;
      }
      ptr_local._4_4_ = local_218;
      if ((end._3_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_48);
      }
      if ((local_4a & 1) == 0) {
        return ptr_local._4_4_;
      }
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
      return ptr_local._4_4_;
    }
    if (cVar1 == 'b') {
      local_28 = f_bin;
    }
    else if (cVar1 == 'd') {
      local_28 = f_dec;
    }
    else if (cVar1 == 'o') {
      local_28 = f_oct;
    }
    else {
      if (cVar1 != 'x') {
        return nt_unknown;
      }
      local_28 = f_hex;
    }
    value_local = (uint64_t *)((long)value_local + 2);
  }
  bVar2 = judgeCharNumber((char)*value_local,local_28);
  if (bVar2) {
    bVar2 = checkBehindNumber((char *)value_local,local_28,(char **)&local_68);
    puVar4 = value_local;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_88,(char *)puVar4,
                 (allocator *)
                 ((long)&cp._data.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      ptr_local._4_4_ = parseInteger(&local_88,(uint64_t *)_format,(bool)(local_21 & 1),local_28);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&cp._data.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
    }
    else if (((char)*local_68 == 'i') || ((char)*local_68 == 'u')) {
      Common::charptr::charptr((charptr *)local_a8,(char *)value_local,(char *)local_68);
      if ((char)*local_68 == 'i') {
        Common::charptr::to_string_abi_cxx11_(&local_c8,(charptr *)local_a8);
        ptr_local._4_4_ = parseInteger(&local_c8,(uint64_t *)_format,(bool)(local_21 & 1),local_28);
        std::__cxx11::string::~string((string *)&local_c8);
      }
      else if ((local_21 & 1U) == 0) {
        Common::charptr::to_string_abi_cxx11_
                  ((string *)
                   &front._data.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   (charptr *)local_a8);
        ptr_local._4_4_ =
             parseUnsigned((string *)
                           &front._data.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(uint64_t *)_format,local_28);
        std::__cxx11::string::~string
                  ((string *)
                   &front._data.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      else {
        ptr_local._4_4_ = nt_unknown;
      }
      Common::charptr::~charptr((charptr *)local_a8);
    }
    else if ((char)*local_68 == '.') {
      local_68 = (uint64_t *)((long)local_68 + 1);
      Common::charptr::charptr((charptr *)local_108,(char *)value_local,(char *)local_68);
      value_local = local_68;
      bVar2 = checkBehindNumber((char *)local_68,local_28,(char **)0x0);
      if (bVar2) {
        Common::charptr::to_string_abi_cxx11_(&local_128,(charptr *)local_108);
        puVar4 = value_local;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_148,(char *)puVar4,
                   (allocator *)
                   ((long)&front_1._data.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7));
        ptr_local._4_4_ =
             parseFloat(&local_128,&local_148,(uint64_t *)_format,(bool)(local_21 & 1),local_28);
        std::__cxx11::string::~string((string *)&local_148);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&front_1._data.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7));
        std::__cxx11::string::~string((string *)&local_128);
      }
      else {
        ptr_local._4_4_ = nt_unknown;
      }
      Common::charptr::~charptr((charptr *)local_108);
    }
    else if (((char)*local_68 == 'e') || ((char)*local_68 == 'E')) {
      if (local_28 == f_dec) {
        puVar4 = (uint64_t *)((long)local_68 + 1);
        if (*(char *)puVar4 == '\0') {
          ptr_local._4_4_ = nt_unknown;
        }
        else {
          if ((*(char *)puVar4 == '+') || (*(char *)puVar4 == '-')) {
            puVar4 = (uint64_t *)((long)local_68 + 2);
          }
          while (local_68 = puVar4, iVar3 = isdigit((int)(char)*local_68), puVar4 = value_local,
                iVar3 != 0) {
            puVar4 = (uint64_t *)((long)local_68 + 1);
          }
          if (((char)*local_68 == '+') || ((char)*local_68 == '-')) {
            Common::charptr::charptr
                      ((charptr *)((long)&result1 + 8),(char *)value_local,(char *)local_68);
            Common::charptr::to_string_abi_cxx11_
                      ((string *)&result2,(charptr *)((long)&result1 + 8));
            parseFloat((string *)&result2,(uint64_t *)auStack_178,(bool)(local_21 & 1));
            std::__cxx11::string::~string((string *)&result2);
            local_21 = (char)*local_68 == '-';
            value_local = (uint64_t *)((long)local_68 + 1);
            iVar3 = isdigit((int)*(char *)value_local);
            if (iVar3 == 0) {
              ptr_local._4_4_ = nt_unknown;
            }
            else {
              bVar2 = checkBehindNumber((char *)value_local,local_28,(char **)0x0);
              puVar4 = value_local;
              if (bVar2) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_1c0,(char *)puVar4,&local_1c1);
                parseInteger(&local_1c0,&local_1a0,(bool)(local_21 & 1),f_dec);
                std::__cxx11::string::~string((string *)&local_1c0);
                std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
                *_format = (longdouble)(long)local_1a0 + _auStack_178;
                ptr_local._4_4_ = getLimitTypeFloat((uint64_t *)_format);
              }
              else {
                ptr_local._4_4_ = nt_unknown;
              }
            }
            Common::charptr::~charptr((charptr *)((long)&result1 + 8));
          }
          else if ((char)*local_68 == '\0') {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_1e8,(char *)puVar4,&local_1e9);
            ptr_local._4_4_ = parseFloat(&local_1e8,(uint64_t *)_format,(bool)(local_21 & 1));
            std::__cxx11::string::~string((string *)&local_1e8);
            std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
          }
          else {
            ptr_local._4_4_ = nt_unknown;
          }
        }
      }
      else {
        ptr_local._4_4_ = nt_unknown;
      }
    }
    else {
      ptr_local._4_4_ = nt_unknown;
    }
  }
  else {
    ptr_local._4_4_ = nt_unknown;
  }
  return ptr_local._4_4_;
}

Assistant:

NumberType parseNumber(const char *ptr, uint64_t &value)
		{
			bool minus = false;

			Format format = f_dec;

			if (*ptr == '+') {
				ptr++;
			}
			else if (*ptr == '-') {
				minus = true;
				ptr++;
			}

			if (*ptr == '0') {
				ptr++;
				switch (*ptr) {
				case 'b': format = f_bin; ptr++; break;
				case 'o': format = f_oct; ptr++; break;
				case 'd': format = f_dec; ptr++; break;
				case 'x': format = f_hex; ptr++; break;
				case '.':
					// Include : 0. -> 0.0
					return checkBehindNumber(ptr + 1, format) ? parseFloat(ptr - 1, value, minus) : nt_unknown;
				default: return nt_unknown;
				}
			}

			if (!judgeCharNumber(*ptr, format))
				return nt_unknown;

			const char *end;
			if (checkBehindNumber(ptr, format, &end)) {
				return parseInteger(ptr, value, minus, format);
			}
			else {
				if (*end == 'i' || *end == 'u') {
					charptr cp(ptr, end);

					if (*end == 'i') {
						return parseInteger(cp.to_string(), value, minus, format);
					}
					else {
						if (minus) return nt_unknown;

						return parseUnsigned(cp.to_string(), value, format);
					}
				}

				if (*end == '.') {
					end++;
					charptr front(ptr, end);
					ptr = end;

					// Include the number : XXX. -> XXX.0
					if (*ptr == '\0') (void)0;

					if (!checkBehindNumber(ptr, format))
						return nt_unknown;

					return parseFloat(front.to_string(), ptr, value, minus, format);
				}

				if (*end == 'e' || *end == 'E') {
					if (format != f_dec)
						return nt_unknown;

					end++;
					if (*end == '\0')
						return nt_unknown;

					if (*end == '+' || *end == '-') {
						end++;
					}
					while (isdigit(*end)) {
						end++;
					}
					if (*end == '+' || *end == '-') {
						charptr front(ptr, end);
						long double result1;
						parseFloat(front.to_string(), (uint64_t&)result1, minus);

						minus = *end == '-';
						ptr = end + 1;
						if (!isdigit(*ptr))
							return nt_unknown;

						if (!checkBehindNumber(ptr, format))
							return nt_unknown;

						int64_t result2;
						parseInteger(ptr, (uint64_t&)result2, minus, f_dec);

						(long double&)value = result1 + (long double)result2;
						return getLimitTypeFloat(value);
					}
					if (*end != '\0')
						return nt_unknown;

					return parseFloat(ptr, value, minus);
				}
			}

			return nt_unknown;
		}